

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

ExprNode * parse(ptrlen expr,char **error_msg,ptrlen *error_loc)

{
  char *errtext;
  void *endv;
  ptrlen pVar1;
  ExprNode *local_a0;
  ExprNode *en;
  void *local_90;
  undefined1 local_88 [8];
  ParserState ps [1];
  ptrlen *error_loc_local;
  char **error_msg_local;
  ptrlen expr_local;
  
  ps[0].currtext.ptr = (void *)expr.len;
  local_88 = (undefined1  [8])expr.ptr;
  pVar1 = make_ptrlen((void *)local_88,0);
  en = (ExprNode *)pVar1.ptr;
  ps[0].toktext.len = (size_t)en;
  local_90 = (void *)pVar1.len;
  ps[0].lasttoktext.ptr = local_90;
  ps[0].lasttoktext.len = 0;
  advance((ParserState *)local_88);
  local_a0 = parse_expr((ParserState *)local_88);
  if ((local_a0 != (ExprNode *)0x0) && ((int)ps[0].currtext.len != 6)) {
    errtext = dupstr("unexpected text at end of expression");
    endv = ptrlen_end(expr);
    pVar1 = make_ptrlen_startend((void *)ps[0]._16_8_,endv);
    error((ParserState *)local_88,errtext,pVar1);
    exprnode_free(local_a0);
    local_a0 = (ExprNode *)0x0;
  }
  if (local_a0 == (ExprNode *)0x0) {
    if (error_msg == (char **)0x0) {
      safefree((void *)ps[0].lasttoktext.len);
    }
    else {
      *error_msg = (char *)ps[0].lasttoktext.len;
    }
    if (error_loc != (ptrlen *)0x0) {
      error_loc->ptr = ps[0].err;
      error_loc->len = (size_t)ps[0].errloc.ptr;
    }
    expr_local.len = 0;
  }
  else {
    expr_local.len = (size_t)local_a0;
  }
  return (ExprNode *)expr_local.len;
}

Assistant:

static ExprNode *parse(ptrlen expr, char **error_msg, ptrlen *error_loc)
{
    ParserState ps[1];
    ps->currtext = expr;
    ps->lasttoktext = make_ptrlen(ps->currtext.ptr, 0);
    ps->err = NULL;
    advance(ps);

    ExprNode *en = parse_expr(ps);
    if (en && ps->tok != TOK_END) {
        error(ps, dupstr("unexpected text at end of expression"),
              make_ptrlen_startend(ps->toktext.ptr, ptrlen_end(expr)));
        exprnode_free(en);
        en = NULL;
    }

    if (!en) {
        if (error_msg)
            *error_msg = ps->err;
        else
            sfree(ps->err);
        if (error_loc)
            *error_loc = ps->errloc;
        return NULL;
    }

    return en;
}